

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O2

engr * engr_at(level *lev,xchar x,xchar y)

{
  engr *peVar1;
  
  peVar1 = (engr *)&lev->lev_engr;
  do {
    peVar1 = peVar1->nxt_engr;
    if (peVar1 == (engr *)0x0) {
      return peVar1;
    }
  } while ((peVar1->engr_x != x) || (peVar1->engr_y != y));
  return peVar1;
}

Assistant:

struct engr *engr_at(struct level *lev, xchar x, xchar y)
{
	struct engr *ep = lev->lev_engr;

	while (ep) {
		if (x == ep->engr_x && y == ep->engr_y)
			return ep;
		ep = ep->nxt_engr;
	}
	return NULL;
}